

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void renderScene(void)

{
  undefined4 local_10;
  undefined4 local_c;
  int i;
  int passCnt;
  
  loadSphereDataBuffers(1.0);
  if ((g_framebuffer.flags.progressive & 1U) == 0) {
    local_c = g_framebuffer.samplesPerPixel / g_framebuffer.samplesPerPass;
    if (local_c == 0) {
      local_c = 1;
    }
    for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
      loadRandomBuffer();
      renderSceneProgressive();
    }
  }
  else {
    renderSceneProgressive();
  }
  return;
}

Assistant:

void renderScene()
{
    loadSphereDataBuffers(1.f);
    if (g_framebuffer.flags.progressive) {
        renderSceneProgressive();
    } else {
        int passCnt = g_framebuffer.samplesPerPixel
                    / g_framebuffer.samplesPerPass;

        if (!passCnt) passCnt = 1;
        for (int i = 0; i < passCnt; ++i) {
            loadRandomBuffer();
            renderSceneProgressive();
        }
    }
}